

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyHelpers.cpp
# Opt level: O2

void btSoftBodyHelpers::DrawInfos
               (btSoftBody *psb,btIDebugDraw *idraw,bool masses,bool areas,bool param_5)

{
  Node *pNVar1;
  long lVar2;
  int i;
  long lVar3;
  char buff [1024];
  char text [2048];
  
  lVar2 = 100;
  for (lVar3 = 0; lVar3 < (psb->m_nodes).m_size; lVar3 = lVar3 + 1) {
    pNVar1 = (psb->m_nodes).m_data;
    memset(text,0,0x800);
    if (masses) {
      sprintf(buff," M(%.2f)",
              (double)(1.0 / *(float *)((long)(pNVar1->m_x).m_floats + lVar2 + -0x14)));
      strcat(text,buff);
    }
    if (areas) {
      sprintf(buff," A(%.2f)",
              (double)*(float *)((long)&(((Node *)(&pNVar1->m_x + -1))->super_Feature).super_Element
                                        .m_tag + lVar2));
      strcat(text,buff);
    }
    if (text[0] != '\0') {
      (*idraw->_vptr_btIDebugDraw[0xc])(idraw,(long)(pNVar1->m_x).m_floats + lVar2 + -100,text);
    }
    lVar2 = lVar2 + 0x78;
  }
  return;
}

Assistant:

void			btSoftBodyHelpers::DrawInfos(		btSoftBody* psb,
											 btIDebugDraw* idraw,
											 bool masses,
											 bool areas,
											 bool /*stress*/)
{
	for(int i=0;i<psb->m_nodes.size();++i)
	{
		const btSoftBody::Node&	n=psb->m_nodes[i];
		char					text[2048]={0};
		char					buff[1024];
		if(masses)
		{
			sprintf(buff," M(%.2f)",1/n.m_im);
			strcat(text,buff);
		}
		if(areas)
		{
			sprintf(buff," A(%.2f)",n.m_area);
			strcat(text,buff);
		}
		if(text[0]) idraw->draw3dText(n.m_x,text);
	}
}